

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcSizeContents(ImGuiWindow *window)

{
  long in_RDI;
  ImVec2 sz;
  ImVec2 *in_stack_ffffffffffffffd8;
  float local_20;
  float local_1c;
  ImVec2 local_18;
  long local_10;
  ImVec2 local_8;
  
  if ((*(byte *)(in_RDI + 0x81) & 1) == 0) {
    if ((((*(byte *)(in_RDI + 0x85) & 1) == 0) || (*(int *)(in_RDI + 0xac) != 0)) ||
       (*(int *)(in_RDI + 0xa8) < 1)) {
      local_10 = in_RDI;
      ImVec2::ImVec2(&local_18);
      if ((*(float *)(local_10 + 0x38) != 0.0) || (NAN(*(float *)(local_10 + 0x38)))) {
        local_1c = *(float *)(local_10 + 0x38);
      }
      else {
        local_1c = (*(float *)(local_10 + 0xe8) - *(float *)(local_10 + 0x10)) +
                   *(float *)(local_10 + 0x5c);
      }
      local_18.x = (float)(int)local_1c;
      if ((*(float *)(local_10 + 0x3c) != 0.0) || (NAN(*(float *)(local_10 + 0x3c)))) {
        local_20 = *(float *)(local_10 + 0x3c);
      }
      else {
        local_20 = (*(float *)(local_10 + 0xec) - *(float *)(local_10 + 0x14)) +
                   *(float *)(local_10 + 0x60);
      }
      local_18.y = (float)(int)local_20;
      local_8 = operator+(in_stack_ffffffffffffffd8,(ImVec2 *)0x149339);
    }
    else {
      local_8 = *(ImVec2 *)(in_RDI + 0x30);
    }
  }
  else {
    local_8 = *(ImVec2 *)(in_RDI + 0x30);
  }
  return local_8;
}

Assistant:

static ImVec2 CalcSizeContents(ImGuiWindow* window)
{
    if (window->Collapsed)
        return window->SizeContents;
    if (window->Hidden && window->HiddenFramesForResize == 0 && window->HiddenFramesRegular > 0)
        return window->SizeContents;

    ImVec2 sz;
    sz.x = (float)(int)((window->SizeContentsExplicit.x != 0.0f) ? window->SizeContentsExplicit.x : (window->DC.CursorMaxPos.x - window->Pos.x + window->Scroll.x));
    sz.y = (float)(int)((window->SizeContentsExplicit.y != 0.0f) ? window->SizeContentsExplicit.y : (window->DC.CursorMaxPos.y - window->Pos.y + window->Scroll.y));
    return sz + window->WindowPadding;
}